

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

void __thiscall
Importer_isResolvedReferencedUnitsMissing_Test::~Importer_isResolvedReferencedUnitsMissing_Test
          (Importer_isResolvedReferencedUnitsMissing_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, isResolvedReferencedUnitsMissing)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/main_referenced_units_missing.cellml"));
    auto importer = libcellml::Importer::create();

    EXPECT_TRUE(model->hasUnresolvedImports());
    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(1), importer->libraryCount());

    auto units = model->units(0);

    EXPECT_TRUE(units->isResolved());
    EXPECT_FALSE(units->isDefined());

    EXPECT_FALSE(model->hasUnresolvedImports());
    EXPECT_FALSE(model->isDefined());
}